

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O2

void __thiscall
ot::commissioner::CommissionerSafe::
PanIdQuery(std::function<void(ot::commissioner::Error)>,unsigned_int,unsigned_short,std::__cxx11::string_const&)
::$_0::~__0(__0 *this)

{
  std::__cxx11::string::~string((string *)(this + 0x30));
  std::_Function_base::~_Function_base((_Function_base *)(this + 8));
  return;
}

Assistant:

Error CommissionerSafe::PanIdQuery(uint32_t aChannelMask, uint16_t aPanId, const std::string &aDstAddr)
{
    std::promise<Error> pro;
    auto                wait = [&pro](Error error) { pro.set_value(error); };

    PanIdQuery(wait, aChannelMask, aPanId, aDstAddr);
    return pro.get_future().get();
}